

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::Consume(ParserImpl *this,string *value)

{
  size_t __n;
  size_t sVar1;
  int iVar2;
  bool bVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  string_view message;
  string local_98;
  undefined8 local_78;
  char *local_70;
  size_t local_68;
  pointer local_60;
  undefined8 local_58;
  char *local_50;
  size_t local_48;
  pointer local_40;
  undefined8 local_38;
  char *local_30;
  
  __n = (this->tokenizer_).current_.text._M_string_length;
  sVar1 = value->_M_string_length;
  bVar3 = true;
  if (__n == sVar1) {
    if (__n == 0) {
      bVar3 = false;
    }
    else {
      iVar2 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,(value->_M_dataplus)._M_p,__n);
      bVar3 = iVar2 != 0;
    }
  }
  if (bVar3 == false) {
    io::Tokenizer::Next(&this->tokenizer_);
  }
  else {
    local_60 = (value->_M_dataplus)._M_p;
    local_40 = (this->tokenizer_).current_.text._M_dataplus._M_p;
    local_78 = 10;
    local_70 = "Expected \"";
    local_58 = 10;
    local_50 = "\", found \"";
    local_38 = 2;
    local_30 = "\".";
    pieces._M_len = (size_type)local_40;
    pieces._M_array = (iterator)&DAT_00000005;
    local_68 = sVar1;
    local_48 = __n;
    absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
              (&local_98,(strings_internal *)&local_78,pieces);
    message._M_str = local_98._M_dataplus._M_p;
    message._M_len = local_98._M_string_length;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool Consume(const std::string& value) {
    const std::string& current_value = tokenizer_.current().text;

    if (current_value != value) {
      ReportError(absl::StrCat("Expected \"", value, "\", found \"",
                               current_value, "\"."));
      return false;
    }

    tokenizer_.Next();

    return true;
  }